

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O2

unsigned_short med3char<unsigned_short>(unsigned_short a,unsigned_short b,unsigned_short c)

{
  if (a == b) {
    return a;
  }
  if (c == b || c == a) {
    return c;
  }
  if (a < b) {
    if (c <= b) {
      if (a <= c) {
        return c;
      }
      return a;
    }
  }
  else if (b <= c) {
    if (c <= a) {
      return c;
    }
    return a;
  }
  return b;
}

Assistant:

CharT
med3char(CharT a, CharT b, CharT c)
{
	if (a == b)           return a;
	if (c == a || c == b) return c;
	if (a < b) {
		if (b < c) return b;
		if (a < c) return c;
		return a;
	}
	if (b > c) return b;
	if (a < c) return a;
	return c;
}